

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O0

void * __thiscall jpgd::jpeg_decoder::alloc(jpeg_decoder *this,size_t nSize,bool zero)

{
  ulong __n;
  byte in_DL;
  ulong in_RSI;
  long in_RDI;
  mem_block *b_1;
  int capacity;
  mem_block *b;
  char *rv;
  jpgd_status in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  uint uVar1;
  uint uVar2;
  ulong local_48;
  undefined8 *local_28;
  undefined8 *local_20;
  
  local_48 = in_RSI;
  if (in_RSI < 2) {
    local_48 = 1;
  }
  __n = local_48 + 3 & 0xfffffffffffffffc;
  local_20 = (undefined8 *)0x0;
  local_28 = *(undefined8 **)(in_RDI + 0xd0);
  do {
    if (local_28 == (undefined8 *)0x0) {
LAB_00339099:
      if (local_20 == (undefined8 *)0x0) {
        if ((int)((int)__n + 0x7ffU & 0xfffff800) < 0x7f00) {
          uVar1 = 0x7f00;
        }
        else {
          uVar1 = (int)__n + 0x7ffU & 0xfffff800;
        }
        uVar2 = uVar1;
        local_20 = (undefined8 *)jpgd_malloc(0x3390f5);
        if (local_20 == (undefined8 *)0x0) {
          stop_decoding((jpeg_decoder *)CONCAT44(uVar2,in_stack_ffffffffffffffb0),
                        in_stack_ffffffffffffffac);
        }
        *local_20 = *(undefined8 *)(in_RDI + 0xd0);
        *(undefined8 **)(in_RDI + 0xd0) = local_20;
        local_20[1] = __n;
        local_20[2] = (long)(int)uVar1;
        local_20 = local_20 + 3;
      }
      if ((in_DL & 1) != 0) {
        memset(local_20,0,__n);
      }
      return local_20;
    }
    if (local_28[1] + __n <= (ulong)local_28[2]) {
      local_20 = (undefined8 *)((long)local_28 + local_28[1] + 0x18);
      local_28[1] = __n + local_28[1];
      goto LAB_00339099;
    }
    local_28 = (undefined8 *)*local_28;
  } while( true );
}

Assistant:

void* jpeg_decoder::alloc(size_t nSize, bool zero)
	{
		nSize = (JPGD_MAX(nSize, 1) + 3) & ~3;
		char* rv = nullptr;
		for (mem_block* b = m_pMem_blocks; b; b = b->m_pNext)
		{
			if ((b->m_used_count + nSize) <= b->m_size)
			{
				rv = b->m_data + b->m_used_count;
				b->m_used_count += nSize;
				break;
			}
		}
		if (!rv)
		{
			int capacity = JPGD_MAX(32768 - 256, ((int)nSize + 2047) & ~2047);
			mem_block* b = (mem_block*)jpgd_malloc(sizeof(mem_block) + capacity);
			if (!b)
			{
				stop_decoding(JPGD_NOTENOUGHMEM);
			}

			b->m_pNext = m_pMem_blocks;
			m_pMem_blocks = b;
			b->m_used_count = nSize;
			b->m_size = capacity;
			rv = b->m_data;
		}
		if (zero) memset(rv, 0, nSize);
		return rv;
	}